

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlCDataSection(ostream *stream,char *data)

{
  char *pcVar1;
  char *in_RSI;
  ostream *in_RDI;
  char *next_segment;
  char *segment;
  char *local_18;
  
  std::operator<<(in_RDI,"<![CDATA[");
  local_18 = in_RSI;
  while( true ) {
    pcVar1 = strstr(local_18,"]]>");
    if (pcVar1 == (char *)0x0) break;
    std::ostream::write((char *)in_RDI,(long)local_18);
    std::operator<<(in_RDI,"]]>]]&gt;<![CDATA[");
    local_18 = pcVar1 + 3;
  }
  std::operator<<(in_RDI,local_18);
  std::operator<<(in_RDI,"]]>");
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlCDataSection(::std::ostream* stream,
                                                     const char* data) {
  const char* segment = data;
  *stream << "<![CDATA[";
  for (;;) {
    const char* const next_segment = strstr(segment, "]]>");
    if (next_segment != nullptr) {
      stream->write(segment,
                    static_cast<std::streamsize>(next_segment - segment));
      *stream << "]]>]]&gt;<![CDATA[";
      segment = next_segment + strlen("]]>");
    } else {
      *stream << segment;
      break;
    }
  }
  *stream << "]]>";
}